

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

Compiler * __thiscall
spirv_cross::Compiler::get_remapped_declared_block_name_abi_cxx11_
          (Compiler *this,uint32_t id,bool fallback_prefer_instance_name)

{
  bool bVar1;
  uint32_t uVar2;
  pointer pvVar3;
  ulong uVar4;
  byte in_CL;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  Compiler *this_00;
  Meta *local_80;
  TypedID<(spirv_cross::Types)2> local_5c;
  Meta *local_58;
  string *block_name;
  Meta *local_48;
  Meta *type_meta;
  SPIRType *type;
  SPIRVariable *var;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_28;
  const_iterator itr;
  bool fallback_prefer_instance_name_local;
  uint32_t id_local;
  Compiler *this_local;
  
  this_00 = (Compiler *)CONCAT44(in_register_00000034,id);
  itr.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_cur._4_4_ = (uint32_t)CONCAT71(in_register_00000011,fallback_prefer_instance_name);
  itr.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_cur._3_1_ = in_CL & 1;
  local_28._M_cur =
       (__node_type *)
       ::std::
       unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this_00->declared_block_names,
              (key_type *)
              ((long)&itr.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                      ._M_cur + 4));
  var = (SPIRVariable *)
        ::std::
        end<std::unordered_map<unsigned_int,std::__cxx11::string,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>>
                  (&this_00->declared_block_names);
  bVar1 = ::std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                      *)&var);
  if (bVar1) {
    pvVar3 = ::std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                           *)&local_28);
    ::std::__cxx11::string::string((string *)this,(string *)&pvVar3->second);
  }
  else {
    type = (SPIRType *)
           get<spirv_cross::SPIRVariable>
                     (this_00,itr.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                              ._M_cur._4_4_);
    if ((itr.
         super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
         ._M_cur._3_1_ & 1) == 0) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).field_0xc);
      type_meta = (Meta *)get<spirv_cross::SPIRType>(this_00,uVar2);
      block_name._4_4_ = ((ID *)&(type_meta->decoration).field_0x8)->id;
      local_48 = ParsedIR::find_meta(&this_00->ir,block_name._4_4_);
      local_80 = local_48;
      if (local_48 == (Meta *)0x0) {
        local_80 = (Meta *)0x0;
      }
      local_58 = local_80;
      if ((local_80 == (Meta *)0x0) || (uVar4 = ::std::__cxx11::string::empty(), (uVar4 & 1) != 0))
      {
        TypedID<(spirv_cross::Types)2>::TypedID
                  (&local_5c,
                   itr.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                   ._M_cur._4_4_);
        (*this_00->_vptr_Compiler[4])(this,this_00,(ulong)local_5c.id);
      }
      else {
        ::std::__cxx11::string::string((string *)this,(string *)local_58);
      }
    }
    else {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*this_00->_vptr_Compiler[6])(this,this_00,(ulong)uVar2,1);
    }
  }
  return this;
}

Assistant:

std::string Compiler::get_remapped_declared_block_name(uint32_t id, bool fallback_prefer_instance_name) const
{
	auto itr = declared_block_names.find(id);
	if (itr != end(declared_block_names))
	{
		return itr->second;
	}
	else
	{
		auto &var = get<SPIRVariable>(id);

		if (fallback_prefer_instance_name)
		{
			return to_name(var.self);
		}
		else
		{
			auto &type = get<SPIRType>(var.basetype);
			auto *type_meta = ir.find_meta(type.self);
			auto *block_name = type_meta ? &type_meta->decoration.alias : nullptr;
			return (!block_name || block_name->empty()) ? get_block_fallback_name(id) : *block_name;
		}
	}
}